

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigs.h
# Opt level: O3

void __thiscall
sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::disconnect
          (BasicSignal<int_(),_std::lock_guard<std::mutex>_> *this,
          optional<std::shared_ptr<sigs::ConnectionBase>_> *conn)

{
  int iVar1;
  undefined8 local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  char local_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  if ((conn->super__Optional_base<std::shared_ptr<sigs::ConnectionBase>,_false,_false>)._M_payload.
      super__Optional_payload<std::shared_ptr<sigs::ConnectionBase>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<sigs::ConnectionBase>_>._M_engaged == false) {
    clear(this);
    return;
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->entriesMutex);
  if (iVar1 == 0) {
    local_40 = '\0';
    if ((conn->super__Optional_base<std::shared_ptr<sigs::ConnectionBase>,_false,_false>)._M_payload
        .super__Optional_payload<std::shared_ptr<sigs::ConnectionBase>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<sigs::ConnectionBase>_>._M_engaged == true) {
      local_50 = (conn->super__Optional_base<std::shared_ptr<sigs::ConnectionBase>,_false,_false>).
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<sigs::ConnectionBase>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<sigs::ConnectionBase>_>._M_payload.
                 _M_value.super___shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      local_48 = (conn->super__Optional_base<std::shared_ptr<sigs::ConnectionBase>,_false,_false>).
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<sigs::ConnectionBase>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<sigs::ConnectionBase>_>._M_payload.
                 _M_value.super___shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_48->_M_use_count = local_48->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_48->_M_use_count = local_48->_M_use_count + 1;
        }
      }
      local_40 = '\x01';
    }
    local_28 = (code *)0x0;
    pcStack_20 = (code *)0x0;
    local_38._M_unused._M_object = (void *)0x0;
    local_38._8_8_ = 0;
    std::_Function_base::
    _Base_manager<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::disconnect(std::optional<std::shared_ptr<sigs::ConnectionBase>>const&)::{lambda(auto:1)#1}>
    ::
    _M_create<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::disconnect(std::optional<std::shared_ptr<sigs::ConnectionBase>>const&)::_lambda(auto:1)_1_>
              (&local_38,&local_50);
    pcStack_20 = std::
                 _Function_handler<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/netromdk[P]sigs/sigs.h:391:18)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry>_>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/netromdk[P]sigs/sigs.h:391:18)>
               ::_M_manager;
    eraseEntries(this,(function<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry>_>_>)>
                       *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    if (local_40 == '\x01') {
      local_40 = '\0';
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->entriesMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void disconnect(const std::optional<Connection> &conn = std::nullopt) noexcept
  {
    if (!conn) {
      clear();
      return;
    }

    Lock lock(entriesMutex);
    eraseEntries([conn](auto it) { return it->conn() == conn; });
  }